

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort_impl.h
# Opt level: O0

void heap_down(uchar *a,size_t i,size_t heap_size,size_t stride,
              _func_int_void_ptr_void_ptr_void_ptr *cmp,void *cmp_data)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  uchar *in_RDI;
  code *in_R8;
  undefined8 in_R9;
  size_t in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  ulong local_10;
  
  local_10 = in_RSI;
  do {
    while( true ) {
      if (in_RDX >> 1 <= local_10) {
        return;
      }
      if (0x7ffffffffffffffe < local_10) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/hsort_impl.h"
                ,0x2d,"test condition failed: i <= SIZE_MAX/2 - 1");
        abort();
      }
      sVar2 = child1(0x1325c3);
      if (in_RDX <= sVar2) {
        fprintf(_stderr,"%s:%d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/modules/extrakeys/hsort_impl.h"
                ,0x35,"test condition failed: child1(i) < heap_size");
        abort();
      }
      sVar2 = child2(0x13261e);
      if (sVar2 < in_RDX) break;
LAB_0013276f:
      in_stack_ffffffffffffff80 = in_RDI;
      sVar2 = child1(0x132793);
      iVar1 = (*in_R8)(in_stack_ffffffffffffff80 + sVar2 * in_RCX,in_RDI + local_10 * in_RCX,in_R9);
      if (iVar1 < 1) {
        return;
      }
      in_stack_ffffffffffffff70 = in_RDI;
      child1(0x1327f8);
      heap_swap(in_stack_ffffffffffffff80,local_10,(size_t)in_stack_ffffffffffffff70,
                in_stack_ffffffffffffff68);
      sVar2 = child1(0x13281c);
      in_stack_ffffffffffffff78 = local_10;
      local_10 = sVar2;
    }
    sVar2 = child2(0x132650);
    sVar3 = child1(0x132680);
    iVar1 = (*in_R8)(in_RDI + sVar2 * in_RCX,in_RDI + sVar3 * in_RCX,in_R9);
    if (iVar1 < 0) goto LAB_0013276f;
    sVar2 = child2(0x1326d2);
    iVar1 = (*in_R8)(in_RDI + sVar2 * in_RCX,in_RDI + local_10 * in_RCX,in_R9);
    if (iVar1 < 1) {
      return;
    }
    child2(0x132737);
    heap_swap(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70,
              in_stack_ffffffffffffff68);
    local_10 = child2(0x13275b);
  } while( true );
}

Assistant:

static SECP256K1_INLINE void heap_down(unsigned char *a, size_t i, size_t heap_size, size_t stride,
                            int (*cmp)(const void *, const void *, void *), void *cmp_data) {
    while (i < heap_size/2) {
        VERIFY_CHECK(i <= SIZE_MAX/2 - 1);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size <= SIZE_MAX
         * 2*i <= SIZE_MAX - 2
         */

        VERIFY_CHECK(child1(i) < heap_size);
        /* Proof:
         * i < heap_size/2
         * i + 1 <= heap_size/2
         * 2*i + 2 <= heap_size
         * 2*i + 1 < heap_size
         * child1(i) < heap_size
         */

        /* Let [x] be notation for the contents at a[x*stride].
         *
         * If [child1(i)] > [i] and [child2(i)] > [i],
         *   swap [i] with the larger child to ensure the new parent is larger
         *   than both children. When [child1(i)] == [child2(i)], swap [i] with
         *   [child2(i)].
         * Else if [child1(i)] > [i], swap [i] with [child1(i)].
         * Else if [child2(i)] > [i], swap [i] with [child2(i)].
         */
        if (child2(i) < heap_size
                && 0 <= cmp(a + child2(i)*stride, a + child1(i)*stride, cmp_data)) {
            if (0 < cmp(a + child2(i)*stride, a +         i*stride, cmp_data)) {
                heap_swap(a, i, child2(i), stride);
                i = child2(i);
            } else {
                /* At this point we have [child2(i)] >= [child1(i)] and we have
                 * [child2(i)] <= [i], and thus [child1(i)] <= [i] which means
                 * that the next comparison can be skipped. */
                return;
            }
        } else if (0 < cmp(a + child1(i)*stride, a +         i*stride, cmp_data)) {
            heap_swap(a, i, child1(i), stride);
            i = child1(i);
        } else {
            return;
        }
    }
    /* heap_size/2 <= i
     * heap_size/2 < i + 1
     * heap_size < 2*i + 2
     * heap_size <= 2*i + 1
     * heap_size <= child1(i)
     * Thus child1(i) and child2(i) are now out of bounds and we are at a leaf.
     */
}